

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

int __thiscall
slang::IntervalMapDetails::
NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U>::adjustFromLeftSib
          (NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U> *this,
          uint32_t size,
          NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U> *sib,
          uint32_t sibSize,int toAdd)

{
  unsigned_long *puVar1;
  unsigned_long uVar2;
  uint uVar3;
  uint32_t end_1;
  uint uVar4;
  int iVar5;
  interval<unsigned_long> *piVar6;
  long lVar7;
  
  if (toAdd < 1) {
    uVar4 = -toAdd;
    if (size <= (uint)-toAdd) {
      uVar4 = size;
    }
    if (0xb - sibSize < uVar4) {
      uVar4 = 0xb - sibSize;
    }
    piVar6 = this->first;
    uVar3 = uVar4;
    if (uVar4 != 0) {
      lVar7 = 0;
      do {
        puVar1 = (unsigned_long *)((long)&this->first[0].left + lVar7);
        uVar2 = puVar1[1];
        sib->first[sibSize].left = *puVar1;
        sib->first[sibSize].right = uVar2;
        sibSize = sibSize + 1;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)uVar4 << 4 != lVar7);
    }
    for (; uVar3 != size; uVar3 = uVar3 + 1) {
      uVar2 = this->first[uVar3].right;
      ((interval<unsigned_long> *)&piVar6->left)->left = this->first[uVar3].left;
      piVar6->right = uVar2;
      piVar6 = piVar6 + 1;
    }
    return -uVar4;
  }
  if (sibSize < (uint)toAdd) {
    toAdd = sibSize;
  }
  if (0xb - size < (uint)toAdd) {
    toAdd = 0xb - size;
  }
  if (size != 0) {
    piVar6 = this->first + (size - 1);
    do {
      uVar2 = piVar6->right;
      this->first[(toAdd - 1U) + size].left = piVar6->left;
      this->first[(toAdd - 1U) + size].right = uVar2;
      piVar6 = piVar6 + -1;
      size = size - 1;
    } while (size != 0);
  }
  if (toAdd != 0) {
    iVar5 = -toAdd;
    do {
      uVar2 = sib->first[sibSize + iVar5].right;
      ((interval<unsigned_long> *)&this->first[0].left)->left = sib->first[sibSize + iVar5].left;
      this->first[0].right = uVar2;
      this = (NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U> *)
             ((long)this + 0x10);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0);
  }
  return toAdd;
}

Assistant:

int adjustFromLeftSib(uint32_t size, NodeBase& sib, uint32_t sibSize, int toAdd) {
        if (toAdd > 0) {
            // Copy from sibling.
            uint32_t count = std::min(std::min(uint32_t(toAdd), sibSize), Capacity - size);
            sib.transferToRightSib(sibSize, *this, size, count);
            return int(count);
        }
        else {
            // Copy to sibling.
            uint32_t count = std::min(std::min(uint32_t(-toAdd), size), Capacity - sibSize);
            transferToLeftSib(size, sib, sibSize, count);
            return -int(count);
        }
    }